

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-paint.c
# Opt level: O1

int plutovg_color_parse(plutovg_color_t *color,char *data,int length)

{
  byte *end;
  byte bVar1;
  _Bool _Var2;
  char *it_7;
  size_t sVar3;
  long lVar4;
  ushort **ppuVar5;
  __int32_t **pp_Var6;
  void *pvVar7;
  byte bVar8;
  int iVar9;
  byte *pbVar10;
  byte bVar11;
  byte bVar12;
  ulong uVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  char *it;
  char *it_1;
  byte *pbVar17;
  byte *pbVar18;
  ulong uVar19;
  bool bVar20;
  float a;
  float l;
  float s;
  float h;
  char name [21];
  byte *local_78;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  plutovg_color_t *local_60;
  int local_58;
  undefined4 uStack_54;
  int local_50;
  char *local_38;
  
  if (length == -1) {
    sVar3 = strlen(data);
    length = (int)sVar3;
  }
  lVar4 = (long)length;
  end = (byte *)(data + lVar4);
  pbVar17 = (byte *)data;
  pbVar18 = (byte *)data;
  if (0 < length) {
    do {
      pbVar17 = pbVar18;
      if ((0x20 < (ulong)*pbVar18) || ((0x100002600U >> ((ulong)*pbVar18 & 0x3f) & 1) == 0)) break;
      lVar4 = lVar4 + -1;
      pbVar17 = end;
      pbVar18 = pbVar18 + 1;
    } while (lVar4 != 0);
  }
  if ((end <= pbVar17) || (*pbVar17 != 0x23)) {
    uVar19 = 0;
    bVar20 = pbVar17 < end;
    local_60 = color;
    if (bVar20) {
      local_78 = pbVar17;
      local_38 = data;
      ppuVar5 = __ctype_b_loc();
      lVar4 = (long)(char)*pbVar17;
      data = local_38;
      if ((*(byte *)((long)*ppuVar5 + lVar4 * 2 + 1) & 4) != 0) {
        pp_Var6 = __ctype_tolower_loc();
        uVar19 = 0;
        do {
          uVar13 = uVar19;
          *(char *)((long)&local_58 + uVar13) = (char)(*pp_Var6)[lVar4];
          bVar20 = pbVar17 + uVar13 + 1 < end;
          data = local_38;
          if ((!bVar20) || (0x12 < uVar13)) {
            pbVar17 = pbVar17 + uVar13 + 1;
            uVar19 = (ulong)((int)uVar13 + 1);
            goto LAB_001293bf;
          }
          lVar4 = (long)(char)pbVar17[uVar13 + 1];
          uVar19 = uVar13 + 1;
        } while ((*(byte *)((long)*ppuVar5 + lVar4 * 2 + 1) & 4) != 0);
        pbVar17 = pbVar17 + uVar13 + 1;
        uVar19 = uVar13 + 1 & 0xffffffff;
      }
    }
LAB_001293bf:
    *(undefined1 *)((long)&local_58 + uVar19) = 0;
    local_78 = pbVar17;
    if (local_50 != 0x746e65 || CONCAT44(uStack_54,local_58) != 0x726170736e617274) {
      if ((local_58 == 0x626772) || ((char)uStack_54 == '\0' && local_58 == 0x61626772)) {
        pbVar18 = pbVar17;
        if (bVar20) {
          bVar20 = true;
          do {
            pbVar18 = pbVar17;
            if ((0x20 < (ulong)*pbVar17) || ((0x100002600U >> ((ulong)*pbVar17 & 0x3f) & 1) == 0))
            break;
            pbVar17 = pbVar17 + 1;
            bVar20 = pbVar17 < end;
            pbVar18 = end;
          } while (pbVar17 != end);
        }
        if (bVar20) {
          bVar20 = false;
          if (pbVar18 < end) {
            bVar20 = *pbVar18 == 0x28;
            pbVar18 = pbVar18 + bVar20;
          }
          if (bVar20) {
            local_78 = pbVar18;
            if (pbVar18 < end) {
              do {
                local_78 = pbVar18;
                if ((0x20 < (ulong)*pbVar18) ||
                   ((0x100002600U >> ((ulong)*pbVar18 & 0x3f) & 1) == 0)) break;
                pbVar18 = pbVar18 + 1;
                local_78 = end;
              } while (pbVar18 != end);
            }
            if (local_78 < end) {
              local_70 = 1.0;
              _Var2 = parse_rgb_component((char **)&local_78,(char *)end,&local_64);
              if (_Var2) {
                bVar20 = local_78 < end;
                pbVar17 = local_78;
                if (bVar20) {
                  bVar20 = true;
                  do {
                    pbVar17 = local_78;
                    if ((0x20 < (ulong)*local_78) ||
                       ((0x100002600U >> ((ulong)*local_78 & 0x3f) & 1) == 0)) break;
                    local_78 = local_78 + 1;
                    bVar20 = local_78 < end;
                    pbVar17 = end;
                  } while (local_78 != end);
                }
                if (bVar20) {
                  bVar20 = false;
                  if (pbVar17 < end) {
                    bVar20 = *pbVar17 == 0x2c;
                    pbVar17 = pbVar17 + bVar20;
                  }
                  if (bVar20) {
                    local_78 = pbVar17;
                    if (pbVar17 < end) {
                      do {
                        local_78 = pbVar17;
                        if ((0x20 < (ulong)*pbVar17) ||
                           ((0x100002600U >> ((ulong)*pbVar17 & 0x3f) & 1) == 0)) break;
                        pbVar17 = pbVar17 + 1;
                        local_78 = end;
                      } while (pbVar17 != end);
                    }
                    if (((((local_78 < end) &&
                          (_Var2 = parse_rgb_component((char **)&local_78,(char *)end,&local_68),
                          _Var2)) &&
                         (_Var2 = plutovg_skip_ws_and_comma((char **)&local_78,(char *)end), _Var2))
                        && (_Var2 = parse_rgb_component((char **)&local_78,(char *)end,&local_6c),
                           _Var2)) &&
                       ((_Var2 = plutovg_skip_ws_and_comma((char **)&local_78,(char *)end), !_Var2
                        || (_Var2 = parse_alpha_component((char **)&local_78,(char *)end,&local_70),
                           _Var2)))) {
                      pbVar17 = local_78;
                      if (local_78 < end) {
                        do {
                          pbVar17 = local_78;
                          if ((0x20 < (ulong)*local_78) ||
                             ((0x100002600U >> ((ulong)*local_78 & 0x3f) & 1) == 0)) break;
                          local_78 = local_78 + 1;
                          pbVar17 = end;
                        } while (local_78 != end);
                      }
                      if ((pbVar17 < end) && (*pbVar17 == 0x29)) {
                        local_78 = pbVar17 + 1;
                        plutovg_color_init_rgba(local_60,local_64,local_68,local_6c,local_70);
                        goto LAB_00129a41;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else if ((local_58 == 0x6c7368) || ((char)uStack_54 == '\0' && local_58 == 0x616c7368)) {
        pbVar18 = pbVar17;
        if (bVar20) {
          bVar20 = true;
          do {
            pbVar18 = pbVar17;
            if ((0x20 < (ulong)*pbVar17) || ((0x100002600U >> ((ulong)*pbVar17 & 0x3f) & 1) == 0))
            break;
            pbVar17 = pbVar17 + 1;
            bVar20 = pbVar17 < end;
            pbVar18 = end;
          } while (pbVar17 != end);
        }
        if (bVar20) {
          bVar20 = false;
          if (pbVar18 < end) {
            bVar20 = *pbVar18 == 0x28;
            pbVar18 = pbVar18 + bVar20;
          }
          if (bVar20) {
            local_78 = pbVar18;
            if (pbVar18 < end) {
              do {
                local_78 = pbVar18;
                if ((0x20 < (ulong)*pbVar18) ||
                   ((0x100002600U >> ((ulong)*pbVar18 & 0x3f) & 1) == 0)) break;
                pbVar18 = pbVar18 + 1;
                local_78 = end;
              } while (pbVar18 != end);
            }
            if (local_78 < end) {
              local_70 = 1.0;
              _Var2 = plutovg_parse_number((char **)&local_78,(char *)end,&local_64);
              if ((((_Var2) &&
                   (_Var2 = plutovg_skip_ws_and_comma((char **)&local_78,(char *)end), _Var2)) &&
                  (_Var2 = parse_alpha_component((char **)&local_78,(char *)end,&local_68), _Var2))
                 && (((_Var2 = plutovg_skip_ws_and_comma((char **)&local_78,(char *)end), _Var2 &&
                      (_Var2 = parse_alpha_component((char **)&local_78,(char *)end,&local_6c),
                      _Var2)) &&
                     ((_Var2 = plutovg_skip_ws_and_comma((char **)&local_78,(char *)end), !_Var2 ||
                      (_Var2 = parse_alpha_component((char **)&local_78,(char *)end,&local_70),
                      _Var2)))))) {
                pbVar17 = local_78;
                if (local_78 < end) {
                  do {
                    pbVar17 = local_78;
                    if ((0x20 < (ulong)*local_78) ||
                       ((0x100002600U >> ((ulong)*local_78 & 0x3f) & 1) == 0)) break;
                    local_78 = local_78 + 1;
                    pbVar17 = end;
                  } while (local_78 != end);
                }
                if ((pbVar17 < end) && (*pbVar17 == 0x29)) {
                  local_78 = pbVar17 + 1;
                  plutovg_color_init_hsla(local_60,local_64,local_68,local_6c,local_70);
                  goto LAB_00129a41;
                }
              }
            }
          }
        }
      }
      else {
        pvVar7 = bsearch(&local_58,plutovg_color_parse::colormap,0x94,0x10,color_entry_compare);
        if (pvVar7 != (void *)0x0) {
          plutovg_color_init_argb32(local_60,*(uint *)((long)pvVar7 + 8) | 0xff000000);
          goto LAB_00129a41;
        }
      }
      return 0;
    }
    local_60->r = 0.0;
    local_60->g = 0.0;
    local_60->b = 0.0;
    local_60->a = 0.0;
    goto LAB_00129a41;
  }
  pbVar18 = pbVar17 + 1;
  pbVar10 = pbVar18;
  local_78 = pbVar18;
  if (pbVar18 < end) {
    ppuVar5 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar5 + (long)(char)*pbVar10 * 2 + 1) & 0x10) == 0) break;
      pbVar10 = pbVar10 + 1;
      local_78 = pbVar10;
    } while (pbVar10 < end);
  }
  iVar9 = (int)pbVar10 - (int)pbVar18;
  if (iVar9 - 3U < 2) {
    bVar12 = *pbVar18;
    bVar11 = bVar12 - 0x30;
    bVar8 = bVar11;
    if (9 < bVar11) {
      if ((byte)(bVar12 + 0x9f) < 6) {
        bVar8 = bVar12 + 0xa9;
      }
      else {
        bVar8 = bVar12 - 0x37;
      }
    }
    if (9 < bVar11) {
      if ((byte)(bVar12 + 0x9f) < 6) {
        bVar11 = bVar12 + 0xa9;
      }
      else {
        bVar11 = bVar12 - 0x37;
      }
    }
    bVar16 = pbVar17[2];
    bVar14 = bVar16 - 0x30;
    bVar12 = bVar14;
    if (9 < bVar14) {
      if ((byte)(bVar16 + 0x9f) < 6) {
        bVar12 = bVar16 + 0xa9;
      }
      else {
        bVar12 = bVar16 - 0x37;
      }
    }
    if (9 < bVar14) {
      if ((byte)(bVar16 + 0x9f) < 6) {
        bVar14 = bVar16 + 0xa9;
      }
      else {
        bVar14 = bVar16 - 0x37;
      }
    }
    bVar1 = pbVar17[3];
    bVar15 = bVar1 - 0x30;
    bVar16 = bVar15;
    if (9 < bVar15) {
      if ((byte)(bVar1 + 0x9f) < 6) {
        bVar16 = bVar1 + 0xa9;
      }
      else {
        bVar16 = bVar1 - 0x37;
      }
    }
    if (9 < bVar15) {
      if ((byte)(bVar1 + 0x9f) < 6) {
        bVar15 = bVar1 + 0xa9;
      }
      else {
        bVar15 = bVar1 - 0x37;
      }
    }
    bVar11 = bVar11 | bVar8 << 4;
    bVar14 = bVar14 | bVar12 << 4;
    bVar15 = bVar16 << 4 | bVar15;
    bVar8 = 0xff;
    if (iVar9 == 4) {
      bVar16 = pbVar17[4];
      bVar8 = bVar16 - 0x30;
      bVar12 = bVar8;
      if (9 < bVar8) {
        if ((byte)(bVar16 + 0x9f) < 6) {
          bVar12 = bVar16 + 0xa9;
        }
        else {
          bVar12 = bVar16 - 0x37;
        }
      }
LAB_00129a0b:
      if (9 < bVar8) {
        if ((byte)(bVar16 + 0x9f) < 6) {
          bVar8 = bVar16 + 0xa9;
        }
        else {
          bVar8 = bVar16 - 0x37;
        }
      }
      bVar8 = bVar12 << 4 | bVar8;
    }
  }
  else {
    if ((iVar9 != 8) && (iVar9 != 6)) {
      return 0;
    }
    bVar11 = pbVar17[1];
    bVar12 = pbVar17[2];
    bVar8 = bVar11 - 0x30;
    if (9 < bVar8) {
      if ((byte)(bVar11 + 0x9f) < 6) {
        bVar8 = bVar11 + 0xa9;
      }
      else {
        bVar8 = bVar11 - 0x37;
      }
    }
    bVar11 = bVar12 - 0x30;
    if (9 < bVar11) {
      if ((byte)(bVar12 + 0x9f) < 6) {
        bVar11 = bVar12 + 0xa9;
      }
      else {
        bVar11 = bVar12 - 0x37;
      }
    }
    bVar14 = pbVar17[3];
    bVar16 = pbVar17[4];
    bVar12 = bVar14 - 0x30;
    if (9 < bVar12) {
      if ((byte)(bVar14 + 0x9f) < 6) {
        bVar12 = bVar14 + 0xa9;
      }
      else {
        bVar12 = bVar14 - 0x37;
      }
    }
    bVar14 = bVar16 - 0x30;
    if (9 < bVar14) {
      if ((byte)(bVar16 + 0x9f) < 6) {
        bVar14 = bVar16 + 0xa9;
      }
      else {
        bVar14 = bVar16 - 0x37;
      }
    }
    bVar15 = pbVar17[5];
    bVar1 = pbVar17[6];
    bVar16 = bVar15 - 0x30;
    if (9 < bVar16) {
      if ((byte)(bVar15 + 0x9f) < 6) {
        bVar16 = bVar15 + 0xa9;
      }
      else {
        bVar16 = bVar15 - 0x37;
      }
    }
    bVar15 = bVar1 - 0x30;
    if (9 < bVar15) {
      if ((byte)(bVar1 + 0x9f) < 6) {
        bVar15 = bVar1 + 0xa9;
      }
      else {
        bVar15 = bVar1 - 0x37;
      }
    }
    bVar11 = bVar11 | bVar8 << 4;
    bVar14 = bVar14 | bVar12 << 4;
    bVar15 = bVar16 << 4 | bVar15;
    bVar8 = 0xff;
    if (iVar9 == 8) {
      bVar8 = pbVar17[7];
      bVar16 = pbVar17[8];
      bVar12 = bVar8 - 0x30;
      if (9 < bVar12) {
        if ((byte)(bVar8 + 0x9f) < 6) {
          bVar12 = bVar8 + 0xa9;
        }
        else {
          bVar12 = bVar8 - 0x37;
        }
      }
      bVar8 = bVar16 - 0x30;
      goto LAB_00129a0b;
    }
  }
  plutovg_color_init_rgba8(color,(uint)bVar11,(uint)bVar14,(uint)bVar15,(uint)bVar8);
LAB_00129a41:
  pbVar17 = local_78;
  if (local_78 < end) {
    do {
      pbVar17 = local_78;
      if ((0x20 < (ulong)*local_78) || ((0x100002600U >> ((ulong)*local_78 & 0x3f) & 1) == 0))
      break;
      local_78 = local_78 + 1;
      pbVar17 = end;
    } while (local_78 != end);
  }
  return (int)pbVar17 - (int)data;
}

Assistant:

int plutovg_color_parse(plutovg_color_t* color, const char* data, int length)
{
    if(length == -1)
        length = strlen(data);
    const char* it = data;
    const char* end = it + length;
    plutovg_skip_ws(&it, end);
    if(plutovg_skip_delim(&it, end, '#')) {
        int r, g, b, a = 255;
        const char* begin = it;
        while(it < end && isxdigit(*it))
            ++it;
        int count = it - begin;
        if(count == 3 || count == 4) {
            r = hex_byte(begin[0], begin[0]);
            g = hex_byte(begin[1], begin[1]);
            b = hex_byte(begin[2], begin[2]);
            if(count == 4) {
                a = hex_byte(begin[3], begin[3]);
            }
        } else if(count == 6 || count == 8) {
            r = hex_byte(begin[0], begin[1]);
            g = hex_byte(begin[2], begin[3]);
            b = hex_byte(begin[4], begin[5]);
            if(count == 8) {
                a = hex_byte(begin[6], begin[7]);
            }
        } else {
            return 0;
        }

        plutovg_color_init_rgba8(color, r, g, b, a);
    } else {
        int name_length = 0;
        char name[MAX_NAME + 1];
        while(it < end && name_length < MAX_NAME && isalpha(*it))
            name[name_length++] = tolower(*it++);
        name[name_length] = '\0';

        if(strcmp(name, "transparent") == 0) {
            plutovg_color_init_rgba(color, 0, 0, 0, 0);
        } else if(strcmp(name, "rgb") == 0 || strcmp(name, "rgba") == 0) {
            if(!plutovg_skip_ws_and_delim(&it, end, '('))
                return 0;
            float r, g, b, a = 1.f;
            if(!parse_rgb_component(&it, end, &r)
                || !plutovg_skip_ws_and_comma(&it, end)
                || !parse_rgb_component(&it, end, &g)
                || !plutovg_skip_ws_and_comma(&it, end)
                || !parse_rgb_component(&it, end, &b)) {
                return 0;
            }

            if(plutovg_skip_ws_and_comma(&it, end)
                && !parse_alpha_component(&it, end, &a)) {
                return 0;
            }

            plutovg_skip_ws(&it, end);
            if(!plutovg_skip_delim(&it, end, ')'))
                return 0;
            plutovg_color_init_rgba(color, r, g, b, a);
        } else if(strcmp(name, "hsl") == 0 || strcmp(name, "hsla") == 0) {
            if(!plutovg_skip_ws_and_delim(&it, end, '('))
                return 0;
            float h, s, l, a = 1.f;
            if(!plutovg_parse_number(&it, end, &h)
                || !plutovg_skip_ws_and_comma(&it, end)
                || !parse_alpha_component(&it, end, &s)
                || !plutovg_skip_ws_and_comma(&it, end)
                || !parse_alpha_component(&it, end, &l)) {
                return 0;
            }

            if(plutovg_skip_ws_and_comma(&it, end)
                && !parse_alpha_component(&it, end, &a)) {
                return 0;
            }

            plutovg_skip_ws(&it, end);
            if(!plutovg_skip_delim(&it, end, ')'))
                return 0;
            plutovg_color_init_hsla(color, h, s, l, a);
        } else {
            static const color_entry_t colormap[] = {
                {"aliceblue", 0xF0F8FF},
                {"antiquewhite", 0xFAEBD7},
                {"aqua", 0x00FFFF},
                {"aquamarine", 0x7FFFD4},
                {"azure", 0xF0FFFF},
                {"beige", 0xF5F5DC},
                {"bisque", 0xFFE4C4},
                {"black", 0x000000},
                {"blanchedalmond", 0xFFEBCD},
                {"blue", 0x0000FF},
                {"blueviolet", 0x8A2BE2},
                {"brown", 0xA52A2A},
                {"burlywood", 0xDEB887},
                {"cadetblue", 0x5F9EA0},
                {"chartreuse", 0x7FFF00},
                {"chocolate", 0xD2691E},
                {"coral", 0xFF7F50},
                {"cornflowerblue", 0x6495ED},
                {"cornsilk", 0xFFF8DC},
                {"crimson", 0xDC143C},
                {"cyan", 0x00FFFF},
                {"darkblue", 0x00008B},
                {"darkcyan", 0x008B8B},
                {"darkgoldenrod", 0xB8860B},
                {"darkgray", 0xA9A9A9},
                {"darkgreen", 0x006400},
                {"darkgrey", 0xA9A9A9},
                {"darkkhaki", 0xBDB76B},
                {"darkmagenta", 0x8B008B},
                {"darkolivegreen", 0x556B2F},
                {"darkorange", 0xFF8C00},
                {"darkorchid", 0x9932CC},
                {"darkred", 0x8B0000},
                {"darksalmon", 0xE9967A},
                {"darkseagreen", 0x8FBC8F},
                {"darkslateblue", 0x483D8B},
                {"darkslategray", 0x2F4F4F},
                {"darkslategrey", 0x2F4F4F},
                {"darkturquoise", 0x00CED1},
                {"darkviolet", 0x9400D3},
                {"deeppink", 0xFF1493},
                {"deepskyblue", 0x00BFFF},
                {"dimgray", 0x696969},
                {"dimgrey", 0x696969},
                {"dodgerblue", 0x1E90FF},
                {"firebrick", 0xB22222},
                {"floralwhite", 0xFFFAF0},
                {"forestgreen", 0x228B22},
                {"fuchsia", 0xFF00FF},
                {"gainsboro", 0xDCDCDC},
                {"ghostwhite", 0xF8F8FF},
                {"gold", 0xFFD700},
                {"goldenrod", 0xDAA520},
                {"gray", 0x808080},
                {"green", 0x008000},
                {"greenyellow", 0xADFF2F},
                {"grey", 0x808080},
                {"honeydew", 0xF0FFF0},
                {"hotpink", 0xFF69B4},
                {"indianred", 0xCD5C5C},
                {"indigo", 0x4B0082},
                {"ivory", 0xFFFFF0},
                {"khaki", 0xF0E68C},
                {"lavender", 0xE6E6FA},
                {"lavenderblush", 0xFFF0F5},
                {"lawngreen", 0x7CFC00},
                {"lemonchiffon", 0xFFFACD},
                {"lightblue", 0xADD8E6},
                {"lightcoral", 0xF08080},
                {"lightcyan", 0xE0FFFF},
                {"lightgoldenrodyellow", 0xFAFAD2},
                {"lightgray", 0xD3D3D3},
                {"lightgreen", 0x90EE90},
                {"lightgrey", 0xD3D3D3},
                {"lightpink", 0xFFB6C1},
                {"lightsalmon", 0xFFA07A},
                {"lightseagreen", 0x20B2AA},
                {"lightskyblue", 0x87CEFA},
                {"lightslategray", 0x778899},
                {"lightslategrey", 0x778899},
                {"lightsteelblue", 0xB0C4DE},
                {"lightyellow", 0xFFFFE0},
                {"lime", 0x00FF00},
                {"limegreen", 0x32CD32},
                {"linen", 0xFAF0E6},
                {"magenta", 0xFF00FF},
                {"maroon", 0x800000},
                {"mediumaquamarine", 0x66CDAA},
                {"mediumblue", 0x0000CD},
                {"mediumorchid", 0xBA55D3},
                {"mediumpurple", 0x9370DB},
                {"mediumseagreen", 0x3CB371},
                {"mediumslateblue", 0x7B68EE},
                {"mediumspringgreen", 0x00FA9A},
                {"mediumturquoise", 0x48D1CC},
                {"mediumvioletred", 0xC71585},
                {"midnightblue", 0x191970},
                {"mintcream", 0xF5FFFA},
                {"mistyrose", 0xFFE4E1},
                {"moccasin", 0xFFE4B5},
                {"navajowhite", 0xFFDEAD},
                {"navy", 0x000080},
                {"oldlace", 0xFDF5E6},
                {"olive", 0x808000},
                {"olivedrab", 0x6B8E23},
                {"orange", 0xFFA500},
                {"orangered", 0xFF4500},
                {"orchid", 0xDA70D6},
                {"palegoldenrod", 0xEEE8AA},
                {"palegreen", 0x98FB98},
                {"paleturquoise", 0xAFEEEE},
                {"palevioletred", 0xDB7093},
                {"papayawhip", 0xFFEFD5},
                {"peachpuff", 0xFFDAB9},
                {"peru", 0xCD853F},
                {"pink", 0xFFC0CB},
                {"plum", 0xDDA0DD},
                {"powderblue", 0xB0E0E6},
                {"purple", 0x800080},
                {"rebeccapurple", 0x663399},
                {"red", 0xFF0000},
                {"rosybrown", 0xBC8F8F},
                {"royalblue", 0x4169E1},
                {"saddlebrown", 0x8B4513},
                {"salmon", 0xFA8072},
                {"sandybrown", 0xF4A460},
                {"seagreen", 0x2E8B57},
                {"seashell", 0xFFF5EE},
                {"sienna", 0xA0522D},
                {"silver", 0xC0C0C0},
                {"skyblue", 0x87CEEB},
                {"slateblue", 0x6A5ACD},
                {"slategray", 0x708090},
                {"slategrey", 0x708090},
                {"snow", 0xFFFAFA},
                {"springgreen", 0x00FF7F},
                {"steelblue", 0x4682B4},
                {"tan", 0xD2B48C},
                {"teal", 0x008080},
                {"thistle", 0xD8BFD8},
                {"tomato", 0xFF6347},
                {"turquoise", 0x40E0D0},
                {"violet", 0xEE82EE},
                {"wheat", 0xF5DEB3},
                {"white", 0xFFFFFF},
                {"whitesmoke", 0xF5F5F5},
                {"yellow", 0xFFFF00},
                {"yellowgreen", 0x9ACD32}
            };

            const color_entry_t* entry = bsearch(name, colormap, sizeof(colormap) / sizeof(color_entry_t), sizeof(color_entry_t), color_entry_compare);
            if(entry == NULL)
                return 0;
            plutovg_color_init_argb32(color, 0xFF000000 | entry->value);
        }
    }

    plutovg_skip_ws(&it, end);
    return it - data;
}